

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execAddxEa<(moira::Instr)122,(moira::Mode)4,(moira::Size)2>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 val;
  u32 data2;
  u32 data1;
  u32 ea2;
  u32 ea1;
  
  bVar1 = readOp<(moira::Mode)4,(moira::Size)2,64ul>(this,opcode & 7,&ea1,&data1);
  if (bVar1) {
    (*this->_vptr_Moira[0x19])(this,0xfffffffffffffffe);
    bVar1 = readOp<(moira::Mode)4,(moira::Size)2,64ul>(this,opcode >> 9 & 7,&ea2,&data2);
    if (bVar1) {
      val = addsub<(moira::Instr)122,(moira::Size)2>(this,data1,data2);
      prefetch<0ul>(this);
      writeM<(moira::MemSpace)1,(moira::Size)2,4ul>(this,ea2,val);
    }
  }
  return;
}

Assistant:

void
Moira::execAddxEa(u16 opcode)
{
    const u64 flags =
    (S == Word) ? AE_INC_PC : (S == Long) ? AE_INC_PC | AE_INC_ADDR : 0;
    
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    u32 ea1, ea2, data1, data2;
 
    if (!readOp<M,S, flags>(src, ea1, data1)) {
        if (S == Long) undoAnPD<M,S>(src);
        return;
    }
    
    sync(-2);
    
    if (!readOp<M,S, flags>(dst, ea2, data2)) {
        if (S == Long) undoAnPD<M,S>(dst);
        return;
    }

    u32 result = addsub<I,S>(data1, data2);

    if (S == Long && !MIMIC_MUSASHI) {
        writeM <M, Word> (ea2 + 2, result & 0xFFFF);
        prefetch();
        writeM<M, Word, POLLIPL>(ea2, result >> 16);
        return;
    }

    prefetch();
    writeM<M, S, POLLIPL>(ea2, result);
}